

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::LiteTest_DownCastMessageInvalidReferenceType_Test::
~LiteTest_DownCastMessageInvalidReferenceType_Test
          (LiteTest_DownCastMessageInvalidReferenceType_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LiteTest, DownCastMessageInvalidReferenceType) {
  CastType1 test_type_1;

  MessageLite& test_type_1_pointer = test_type_1;

  ASSERT_DEBUG_DEATH(
      DownCastMessage<CastType2>(test_type_1_pointer),
      absl::StrCat("Cannot downcast ", test_type_1.GetTypeName(), " to ",
                   CastType2::default_instance().GetTypeName()));
}